

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall ApprovalTests::Options::Options(Options *this)

{
  Reporter *pRVar1;
  _Function_base local_30;
  
  FileOptions::FileOptions(&this->fileOptions_);
  *(undefined8 *)((long)&(this->scrubber_).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->scrubber_).super__Function_base._M_functor = Scrubbers::doNothing;
  (this->scrubber_)._M_invoker =
       ::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  (this->scrubber_).super__Function_base._M_manager =
       ::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  pRVar1 = defaultReporter();
  this->reporter_ = pRVar1;
  DefaultNamerFactory::getDefaultNamer();
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::operator()
            ((function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)&this->namer_);
  ::std::_Function_base::~_Function_base(&local_30);
  this->usingDefaultScrubber_ = true;
  return;
}

Assistant:

Options() = default;